

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

Status google::protobuf::anon_unknown_21::FillDefaults
                 (Edition edition,Message *fixed,Message *overridable)

{
  char *pcVar1;
  long lVar2;
  pointer pFVar3;
  bool bVar4;
  FieldDescriptor *field;
  undefined1 *puVar5;
  RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault> __first;
  const_iterator __last;
  ulong uVar6;
  ulong uVar7;
  FieldDescriptor *in_RCX;
  pointer pFVar8;
  Edition value;
  string *psVar9;
  int index;
  undefined4 in_register_0000003c;
  Message *in_R8;
  AlphaNum *in_R9;
  __normal_iterator<google::protobuf::FieldOptions_EditionDefault_*,_std::vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>_>
  __i;
  long lVar10;
  pointer pFVar11;
  FieldDescriptor *field_00;
  Metadata MVar12;
  Metadata MVar13;
  string_view input;
  string_view message;
  string_view message_00;
  vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
  defaults;
  string local_188;
  Descriptor *local_168;
  Edition local_15c;
  string_view local_158 [3];
  char *local_128;
  ulong local_120;
  StringifySink local_108;
  EditionDefault edition_lookup;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  message._M_len = (undefined8 *)CONCAT44(in_register_0000003c,edition);
  MVar12 = Message::GetMetadata(overridable);
  MVar13 = Message::GetMetadata((Message *)in_RCX);
  if (MVar12.descriptor != MVar13.descriptor) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
               ,0x120,"&descriptor == overridable.GetDescriptor()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)local_158);
  }
  value = (Edition)fixed;
  FieldOptions_EditionDefault::FieldOptions_EditionDefault(&edition_lookup);
  FieldOptions_EditionDefault::set_edition(&edition_lookup,value);
  index = 0;
  local_168 = MVar12.descriptor;
  do {
    if (local_168->field_count_ <= index) {
      *message._M_len = 1;
LAB_002467ed:
      FieldOptions_EditionDefault::~FieldOptions_EditionDefault(&edition_lookup);
      return (Status)(uintptr_t)message._M_len;
    }
    field = Descriptor::field(local_168,index);
    bVar4 = FieldOptions::has_feature_support(field->options_);
    field_00 = in_RCX;
    if (bVar4) {
      puVar5 = (undefined1 *)(field->options_->field_0)._impl_.feature_support_;
      if ((FieldOptions_FeatureSupport *)puVar5 == (FieldOptions_FeatureSupport *)0x0) {
        puVar5 = _FieldOptions_FeatureSupport_default_instance_;
      }
      if ((((((undefined1  [32])((FieldOptions_FeatureSupport *)puVar5)->field_0 &
             (undefined1  [32])0x2) == (undefined1  [32])0x0) ||
           (field_00 = (FieldDescriptor *)overridable,
           (((FieldOptions_FeatureSupport *)puVar5)->field_0)._impl_.edition_introduced_ <=
           (int)value)) &&
          (field_00 = in_RCX,
          ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar5)->field_0 &
          (undefined1  [32])0x8) != (undefined1  [32])0x0)) &&
         ((((FieldOptions_FeatureSupport *)puVar5)->field_0)._impl_.edition_removed_ <= (int)value))
      {
        field_00 = (FieldDescriptor *)overridable;
      }
    }
    MVar12 = Message::GetMetadata((Message *)field_00);
    Reflection::ClearField(MVar12.reflection,(Message *)field_00,field);
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_158,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                 ,0x136,"!field.is_repeated()");
LAB_0024684b:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_158);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_158,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                 ,0x137,"field.cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE");
      goto LAB_0024684b;
    }
    __first.it_ = internal::RepeatedPtrFieldBase::elements
                            (&(field->options_->field_0)._impl_.edition_defaults_.
                              super_RepeatedPtrFieldBase);
    __last = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::end
                       (&(field->options_->field_0)._impl_.edition_defaults_);
    std::
    vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>
    ::
    vector<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::FieldOptions_EditionDefault_const>,void>
              ((vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>
                *)&defaults,__first,
               (RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>)__last.it_,
               (allocator_type *)local_158);
    pFVar3 = defaults.
             super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pFVar8 = defaults.
             super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (defaults.
        super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        defaults.
        super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar10 = (long)defaults.
                     super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)defaults.
                     super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = lVar10 / 0x28;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                (defaults.
                 super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 defaults.
                 super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar10 < 0x281) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                  (pFVar8,pFVar3);
      }
      else {
        pFVar11 = pFVar8 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                  (pFVar8,pFVar11);
        for (; pFVar11 != pFVar3; pFVar11 = pFVar11 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                    (pFVar11);
        }
      }
    }
    uVar6 = ((long)defaults.
                   super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)defaults.
                  super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28;
    pFVar8 = defaults.
             super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (uVar7 = uVar6, 0 < (long)uVar7) {
      uVar6 = uVar7 >> 1;
      in_R8 = (Message *)(uVar6 * 0x28);
      if (*(int *)((long)&in_R8[2].super_MessageLite._vptr_MessageLite + (long)pFVar8) <=
          edition_lookup.field_0._impl_.edition_) {
        pFVar8 = pFVar8 + uVar6 + 1;
        uVar6 = ~uVar6 + uVar7;
      }
    }
    if (pFVar8 == defaults.
                  super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      pcVar1 = (field->all_names_).payload_;
      uVar6 = (ulong)*(ushort *)(pcVar1 + 2);
      local_15c = value;
      local_158[0] = absl::lts_20250127::NullSafeStringView("No valid default found for edition ");
      local_108.buffer_._M_dataplus._M_p = (pointer)&local_108.buffer_.field_2;
      local_108.buffer_.field_2._M_allocated_capacity = 0;
      local_108.buffer_.field_2._8_8_ = 0;
      local_108.buffer_._M_string_length = 0;
      local_60.piece_ =
           absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                     (&local_108,&local_15c);
      local_90.piece_ = absl::lts_20250127::NullSafeStringView(" in feature field ");
      local_c0.piece_._M_len = uVar6;
      local_c0.piece_._M_str = pcVar1 + ~uVar6;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_188,(lts_20250127 *)local_158,&local_60,&local_90,&local_c0,in_R9);
      message._M_str = (char *)local_188._M_string_length;
      absl::lts_20250127::FailedPreconditionError(message);
      std::__cxx11::string::~string((string *)&local_188);
      psVar9 = (string *)&local_108;
LAB_002467de:
      std::__cxx11::string::~string(psVar9);
      std::
      vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
      ::~vector(&defaults);
      goto LAB_002467ed;
    }
    psVar9 = (string *)
             ((ulong)pFVar8[-1].field_0._impl_.value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    input._M_str = (char *)field;
    input._M_len = *(size_t *)psVar9;
    bVar4 = TextFormat::ParseFieldValueFromString(*(TextFormat **)(psVar9 + 8),input,field_00,in_R8)
    ;
    if (!bVar4) {
      pcVar1 = (field->all_names_).payload_;
      uVar6 = (ulong)*(ushort *)(pcVar1 + 2);
      std::__cxx11::string::string((string *)&local_128,psVar9);
      local_158[0] = absl::lts_20250127::NullSafeStringView
                               ("Parsing error in edition_defaults for feature field ");
      local_60.piece_._M_str = pcVar1 + ~uVar6;
      local_60.piece_._M_len = uVar6;
      local_90.piece_ = absl::lts_20250127::NullSafeStringView(". Could not parse: ");
      local_c0.piece_._M_len = local_120;
      local_c0.piece_._M_str = local_128;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_188,(lts_20250127 *)local_158,&local_60,&local_90,&local_c0,in_R9);
      message_00._M_str = (char *)local_188._M_string_length;
      message_00._M_len = (size_t)message._M_len;
      absl::lts_20250127::FailedPreconditionError(message_00);
      std::__cxx11::string::~string((string *)&local_188);
      psVar9 = (string *)&local_128;
      goto LAB_002467de;
    }
    std::
    vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
    ::~vector(&defaults);
    index = index + 1;
  } while( true );
}

Assistant:

absl::Status FillDefaults(Edition edition, Message& fixed,
                          Message& overridable) {
  const Descriptor& descriptor = *fixed.GetDescriptor();
  ABSL_CHECK(&descriptor == overridable.GetDescriptor());

  auto comparator = [](const FieldOptions::EditionDefault& a,
                       const FieldOptions::EditionDefault& b) {
    return a.edition() < b.edition();
  };
  FieldOptions::EditionDefault edition_lookup;
  edition_lookup.set_edition(edition);

  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);
    Message* msg = &overridable;
    if (field.options().has_feature_support()) {
      if ((field.options().feature_support().has_edition_introduced() &&
           edition < field.options().feature_support().edition_introduced()) ||
          (field.options().feature_support().has_edition_removed() &&
           edition >= field.options().feature_support().edition_removed())) {
        msg = &fixed;
      }
    }

    msg->GetReflection()->ClearField(msg, &field);
    ABSL_CHECK(!field.is_repeated());
    ABSL_CHECK(field.cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE);

    std::vector<FieldOptions::EditionDefault> defaults{
        field.options().edition_defaults().begin(),
        field.options().edition_defaults().end()};
    absl::c_sort(defaults, comparator);
    auto first_nonmatch =
        absl::c_upper_bound(defaults, edition_lookup, comparator);
    if (first_nonmatch == defaults.begin()) {
      return Error("No valid default found for edition ", edition,
                   " in feature field ", field.full_name());
    }

    const std::string& def = std::prev(first_nonmatch)->value();
    if (!TextFormat::ParseFieldValueFromString(def, &field, msg)) {
      return Error("Parsing error in edition_defaults for feature field ",
                   field.full_name(), ". Could not parse: ", def);
    }
  }

  return absl::OkStatus();
}